

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTrace.c
# Opt level: O0

void Sat_SolverTraceWrite(sat_solver *pSat,int *pBeg,int *pEnd,int fRoot)

{
  FILE *__stream;
  uint uVar1;
  int fRoot_local;
  int *pEnd_local;
  int *pBeg_local;
  sat_solver *pSat_local;
  
  if (pSat->pFile != (FILE *)0x0) {
    pSat->nClauses = pSat->nClauses + 1;
    pSat->nRoots = fRoot + pSat->nRoots;
    for (pEnd_local = pBeg; pEnd_local < pEnd; pEnd_local = pEnd_local + 1) {
      __stream = (FILE *)pSat->pFile;
      uVar1 = lit_print(*pEnd_local);
      fprintf(__stream," %d",(ulong)uVar1);
    }
    fprintf((FILE *)pSat->pFile," 0\n");
  }
  return;
}

Assistant:

void Sat_SolverTraceWrite( sat_solver * pSat, int * pBeg, int * pEnd, int fRoot )
{
    if ( pSat->pFile == NULL )
        return;
    pSat->nClauses++;
    pSat->nRoots += fRoot;
    for ( ; pBeg < pEnd ; pBeg++ )
        fprintf( pSat->pFile, " %d", lit_print(*pBeg) );
    fprintf( pSat->pFile, " 0\n" );
}